

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingInfoWrapper.hpp
# Opt level: O0

void __thiscall
VulkanUtilities::RenderingInfoWrapper::SetStencilAttachmentClearValue
          (RenderingInfoWrapper *this,uint32_t Stencil)

{
  undefined4 uVar1;
  Char *Message;
  type pVVar2;
  char (*in_RCX) [70];
  undefined1 local_38 [8];
  string msg;
  uint32_t Stencil_local;
  RenderingInfoWrapper *this_local;
  
  msg.field_2._12_4_ = Stencil;
  if (((this->m_RI).pStencilAttachment == (VkRenderingAttachmentInfo *)0x0) ||
     (this->m_StencilAttachmentIndex == 0xffffffff)) {
    Diligent::FormatString<char[26],char[70]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_RI.pStencilAttachment != nullptr && m_StencilAttachmentIndex != ~0u",in_RCX);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"SetStencilAttachmentClearValue",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/RenderingInfoWrapper.hpp"
               ,0x79);
    std::__cxx11::string::~string((string *)local_38);
  }
  uVar1 = msg.field_2._12_4_;
  pVVar2 = std::
           unique_ptr<VkRenderingAttachmentInfo[],_std::default_delete<VkRenderingAttachmentInfo[]>_>
           ::operator[](&this->m_Attachments,(ulong)this->m_StencilAttachmentIndex);
  (pVVar2->clearValue).depthStencil.stencil = uVar1;
  pVVar2 = std::
           unique_ptr<VkRenderingAttachmentInfo[],_std::default_delete<VkRenderingAttachmentInfo[]>_>
           ::operator[](&this->m_Attachments,(ulong)this->m_StencilAttachmentIndex);
  pVVar2->loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  this->m_AttachmentClearMask =
       1 << ((byte)this->m_StencilAttachmentIndex & 0x1f) | this->m_AttachmentClearMask;
  return;
}

Assistant:

void SetStencilAttachmentClearValue(uint32_t Stencil)
    {
        VERIFY_EXPR(m_RI.pStencilAttachment != nullptr && m_StencilAttachmentIndex != ~0u);
        m_Attachments[m_StencilAttachmentIndex].clearValue.depthStencil.stencil = Stencil;
        m_Attachments[m_StencilAttachmentIndex].loadOp                          = VK_ATTACHMENT_LOAD_OP_CLEAR;
        m_AttachmentClearMask |= 1u << m_StencilAttachmentIndex;
    }